

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

void __thiscall
Lib::
Map<Kernel::Variable,_Lib::Coproduct<Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::StlHash>
::clear(Map<Kernel::Variable,_Lib::Coproduct<Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::StlHash>
        *this)

{
  Entry *pEVar1;
  ulong uVar2;
  
  if (this->_entries != (Entry *)0x0) {
    array_delete<Lib::Map<Kernel::Variable,Lib::Coproduct<Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RealConstantType>>>,Lib::StlHash>::Entry>
              (this->_entries,(long)this->_capacity);
    pEVar1 = this->_entries;
    if (pEVar1 != (Entry *)0x0) {
      uVar2 = (long)this->_capacity * 0x9c + 0xfU & 0xfffffffffffffff0;
      if (uVar2 == 0) {
        pEVar1->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        pEVar1->_key = (MaybeUninit<Kernel::Variable>)GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEVar1;
      }
      else if (uVar2 < 0x11) {
        pEVar1->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        pEVar1->_key = (MaybeUninit<Kernel::Variable>)GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEVar1;
      }
      else if (uVar2 < 0x19) {
        pEVar1->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        pEVar1->_key = (MaybeUninit<Kernel::Variable>)GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEVar1;
      }
      else if (uVar2 < 0x21) {
        pEVar1->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        pEVar1->_key = (MaybeUninit<Kernel::Variable>)GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar1;
      }
      else if (uVar2 < 0x31) {
        pEVar1->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        pEVar1->_key = (MaybeUninit<Kernel::Variable>)GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar1;
      }
      else if (uVar2 < 0x41) {
        pEVar1->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        pEVar1->_key = (MaybeUninit<Kernel::Variable>)GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar1;
      }
      else {
        operator_delete(pEVar1,0x10);
      }
    }
  }
  *(undefined8 *)((long)&this->_entries + 4) = 0;
  *(undefined8 *)((long)&this->_afterLast + 4) = 0;
  this->_capacity = 0;
  this->_noOfEntries = 0;
  this->_entries = (Entry *)0x0;
  return;
}

Assistant:

void clear()
  {
    if (_entries) {
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,sizeof(Entry)*_capacity,"Map<>");
    }
    _capacity    = 0;
    _noOfEntries = 0;
    _entries     = nullptr;
    _afterLast   = nullptr;
    _maxEntries  = 0;
  }